

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_io_reinit_iter_fn(event_base *base,int fd,evmap_io *ctx,void *arg)

{
  eventop *peVar1;
  event *peVar2;
  int iVar3;
  event *ev;
  short events;
  int *result;
  void *extra;
  eventop *evsel;
  void *arg_local;
  evmap_io *ctx_local;
  int fd_local;
  event_base *base_local;
  
  peVar1 = base->evsel;
  ev._6_2_ = 0;
  if (ctx == (evmap_io *)0x0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
               ,0x267,"ctx","evmap_io_reinit_iter_fn");
  }
  if (ctx->nread != 0) {
    ev._6_2_ = 2;
  }
  if (ctx->nwrite != 0) {
    ev._6_2_ = ev._6_2_ | 4;
  }
  if (ctx->nclose != 0) {
    ev._6_2_ = ev._6_2_ | 0x80;
  }
  if (peVar1->fdinfo_len != 0) {
    memset(ctx + 1,0,peVar1->fdinfo_len);
  }
  if (((ev._6_2_ != 0) && (peVar2 = (ctx->events).lh_first, peVar2 != (event *)0x0)) &&
     ((peVar2->ev_events & 0x20U) != 0)) {
    ev._6_2_ = ev._6_2_ | 0x20;
  }
  iVar3 = (*peVar1->add)(base,fd,0,ev._6_2_,ctx + 1);
  if (iVar3 == -1) {
    *(undefined4 *)arg = 0xffffffff;
  }
  return 0;
}

Assistant:

static int
evmap_io_reinit_iter_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *ctx, void *arg)
{
	const struct eventop *evsel = base->evsel;
	void *extra;
	int *result = arg;
	short events = 0;
	struct event *ev;
	EVUTIL_ASSERT(ctx);

	extra = ((char*)ctx) + sizeof(struct evmap_io);
	if (ctx->nread)
		events |= EV_READ;
	if (ctx->nwrite)
		events |= EV_WRITE;
	if (ctx->nclose)
		events |= EV_CLOSED;
	if (evsel->fdinfo_len)
		memset(extra, 0, evsel->fdinfo_len);
	if (events &&
	    (ev = LIST_FIRST(&ctx->events)) &&
	    (ev->ev_events & EV_ET))
		events |= EV_ET;
	if (evsel->add(base, fd, 0, events, extra) == -1)
		*result = -1;

	return 0;
}